

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this)

{
  pointer *ppnVar1;
  longdouble lVar2;
  int iVar3;
  uint uVar4;
  pointer piVar5;
  pointer pcVar6;
  longdouble lVar7;
  pointer piVar8;
  pointer pnVar9;
  ptrdiff_t _Num;
  long lVar10;
  ulong uVar11;
  longdouble lVar12;
  
  piVar8 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->lower_bound = (longdouble)-INFINITY;
  lVar12 = (longdouble)0;
  lVar10 = (long)piVar5 - (long)piVar8;
  if (lVar10 != 0) {
    lVar7 = (longdouble)0;
    lVar10 = (lVar10 >> 4) * -0x5555555555555555;
    lVar12 = lVar7;
    do {
      lVar2 = piVar8->r;
      if (lVar7 <= lVar2 || lVar2 != lVar7) {
        lVar12 = lVar2 + lVar12;
      }
      piVar8 = piVar8 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  this->upper_bound = lVar12;
  make_init_node_0(this);
  pnVar9 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = pnVar9[-1].sumfactor;
  if (this->b_max < iVar3 || iVar3 < this->b_min) {
    if (this->b_max < iVar3) {
      uVar4 = pnVar9[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar4);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar4) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar4;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar9[-1].sumr;
    uVar11 = (ulong)(this->subvector).m_element_size;
    if (uVar11 != 0) {
      pcVar6 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar6 + this->solution,pcVar6 + pnVar9[-1].variables,uVar11);
    }
  }
  make_init_node_1(this);
  pnVar9 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = pnVar9[-1].sumfactor;
  if (this->b_max < iVar3 || iVar3 < this->b_min) {
    if (this->b_max < iVar3) {
      uVar4 = pnVar9[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar4);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar4) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar4;
      pnVar9 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pnVar9;
    }
  }
  else {
    this->upper_bound = pnVar9[-1].sumr;
    uVar11 = (ulong)(this->subvector).m_element_size;
    if (uVar11 != 0) {
      pcVar6 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar6 + this->solution,pcVar6 + pnVar9[-1].variables,uVar11);
      pnVar9 = (this->nodes).
               super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if ((this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
      ._M_impl.super__Vector_impl_data._M_start != pnVar9) {
    do {
      make_next_inequality_node(this);
    } while ((this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }